

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O0

void __thiscall
cmInstallCommandFileSetArguments::cmInstallCommandFileSetArguments
          (cmInstallCommandFileSetArguments *this,string *defaultComponent)

{
  static_string_view name;
  string local_38;
  string *local_18;
  string *defaultComponent_local;
  cmInstallCommandFileSetArguments *this_local;
  
  local_18 = defaultComponent;
  defaultComponent_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)defaultComponent);
  cmInstallCommandArguments::cmInstallCommandArguments
            (&this->super_cmInstallCommandArguments,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&this->FileSet);
  name = ::cm::operator____s("FILE_SET",8);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)this,name,&this->FileSet);
  return;
}

Assistant:

cmInstallCommandFileSetArguments::cmInstallCommandFileSetArguments(
  std::string defaultComponent)
  : cmInstallCommandArguments(std::move(defaultComponent))
{
  this->Bind("FILE_SET"_s, this->FileSet);
}